

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O2

int __kmp_api_omp_get_team_num(void)

{
  kmp_info_t *pkVar1;
  int iVar2;
  kmp_team_p *pkVar3;
  int iVar4;
  int iVar5;
  
  pkVar1 = __kmp_entry_thread();
  iVar4 = 0;
  if ((pkVar1->th).th_teams_microtask != (microtask_t)0x0) {
    pkVar3 = (pkVar1->th).th_team;
    iVar4 = (pkVar3->t).t_level;
    iVar5 = (pkVar3->t).t_serialized;
    iVar2 = (pkVar1->th).th_teams_level + 1;
LAB_001184de:
    if (iVar2 < iVar4) {
      iVar5 = (pkVar3->t).t_serialized;
      for (; (0 < iVar5 && (iVar2 < iVar4)); iVar4 = iVar4 + -1) {
        iVar5 = iVar5 + -1;
      }
      if (iVar5 != 0 || (pkVar3->t).t_serialized == 0) goto code_r0x0011850c;
      goto LAB_00118512;
    }
    iVar4 = 0;
    if (iVar5 < 2) {
      iVar4 = (pkVar3->t).t_master_tid;
    }
  }
  return iVar4;
code_r0x0011850c:
  if (iVar2 < iVar4) {
    iVar4 = iVar4 + -1;
LAB_00118512:
    pkVar3 = (pkVar3->t).t_parent;
  }
  goto LAB_001184de;
}

Assistant:

int FTN_STDCALL
xexpand(FTN_GET_TEAM_NUM)( void )
{
    #ifdef KMP_STUB
        return 0;
    #else
        kmp_info_t *thr = __kmp_entry_thread();
        if ( thr->th.th_teams_microtask ) {
            kmp_team_t *team = thr->th.th_team;
            int tlevel = thr->th.th_teams_level; // the level of the teams construct
            int ii = team->t.t_level;
            int dd = team -> t.t_serialized;
            int level = tlevel + 1;
            KMP_DEBUG_ASSERT( ii >= tlevel );
            while( ii > level )
            {
                for( dd = team -> t.t_serialized; ( dd > 0 ) && ( ii > level ); dd--, ii-- )
                {
                }
                if( team -> t.t_serialized && ( !dd ) ) {
                    team = team->t.t_parent;
                    continue;
                }
                if( ii > level ) {
                    team = team->t.t_parent;
                    ii--;
                }
            }
            if ( dd > 1 ) {
                return 0;  // teams region is serialized ( 1 team of 1 thread ).
            } else {
                return team->t.t_master_tid;
            }
        } else {
            return 0;
        }
    #endif
}